

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.c
# Opt level: O1

pattern * setItem(void)

{
  pattern *lhs;
  pattern *rhs;
  
  lhs = limitItem();
  while( true ) {
    if ((((4 < lookahead - 400U) || (lookahead - 400U == 2)) && (lookahead != 0x2d)) &&
       (lookahead != 0x28)) break;
    rhs = limitItem();
    lhs = makeNode(lhs,rhs,0x12d);
  }
  return lhs;
}

Assistant:

pattern* setItem() {
   pattern *lhs, *rhs;
   
   lhs = limitItem();
   for (;;) {
      if((lookahead == '(') /* a limitItem must begin with a feature! */
      || (lookahead == NOT_TOK)
      || (lookahead == NUM_TOK)
      || (lookahead ==  ID_TOK)
      || (lookahead == WITHIN_TOK)
      || (lookahead == '-')) {
	 rhs = limitItem();
	 lhs = makeNode(lhs, rhs, AND_NODE);
      }
      else {
	 break;
      }
   }
   return lhs;
}